

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  bool bVar5;
  xmlChar *tmp;
  int count;
  int state;
  int iStack_30;
  xmlChar stop;
  int maxLength;
  int l;
  int cur;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  _size = (xmlChar *)0x0;
  cur = 0;
  l = 100;
  iVar2 = 50000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar2 = 10000000;
  }
  xVar1 = ctxt->instate;
  tmp._0_4_ = 0;
  buf = (xmlChar *)ctxt;
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\"') {
    xmlNextChar((xmlParserCtxtPtr)buf);
    count._3_1_ = 0x22;
  }
  else {
    if (**(char **)(*(long *)(buf + 0x38) + 0x20) != '\'') {
      xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar((xmlParserCtxtPtr)buf);
    count._3_1_ = 0x27;
  }
  _size = (xmlChar *)(*xmlMallocAtomic)((long)l);
  if (_size == (xmlChar *)0x0) {
    xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
  }
  else {
    buf[0x110] = '\r';
    buf[0x111] = '\0';
    buf[0x112] = '\0';
    buf[0x113] = '\0';
    maxLength = xmlCurrentChar((xmlParserCtxtPtr)buf,&stack0xffffffffffffffd0);
    do {
      if (maxLength < 0x100) {
        if (((8 < maxLength) && (maxLength < 0xb)) ||
           ((maxLength == 0xd || (bVar5 = false, 0x1f < maxLength)))) {
LAB_00172cc2:
          bVar5 = maxLength != (uint)count._3_1_;
        }
      }
      else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
               ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
              ((bVar5 = false, 0xffff < maxLength && (bVar5 = false, maxLength < 0x110000))))
      goto LAB_00172cc2;
      if (!bVar5) {
        _size[cur] = '\0';
        *(xmlParserInputState *)(buf + 0x110) = xVar1;
        if (maxLength < 0x100) {
          if (((8 < maxLength) && (maxLength < 0xb)) || ((maxLength == 0xd || (0x1f < maxLength))))
          {
LAB_00173062:
            xmlNextChar((xmlParserCtxtPtr)buf);
            return _size;
          }
        }
        else if ((((0xff < maxLength) && (maxLength < 0xd800)) ||
                 ((0xdfff < maxLength && (maxLength < 0xfffe)))) ||
                ((0xffff < maxLength && (maxLength < 0x110000)))) goto LAB_00173062;
        xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
        return _size;
      }
      pxVar4 = _size;
      if (l <= cur + 5) {
        l = l << 1;
        pxVar4 = (xmlChar *)(*xmlRealloc)(_size,(long)l);
        if (pxVar4 == (xmlChar *)0x0) {
          (*xmlFree)(_size);
          xmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
          *(xmlParserInputState *)(buf + 0x110) = xVar1;
          return (xmlChar *)0x0;
        }
      }
      _size = pxVar4;
      tmp._0_4_ = (int)tmp + 1;
      if (0x32 < (int)tmp) {
        if (((*(int *)(buf + 0x1c4) == 0) &&
            (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) - *(long *)(*(long *)(buf + 0x38) + 0x18)
            )) && (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20)
                   < 500)) {
          xmlSHRINK((xmlParserCtxtPtr)buf);
        }
        if ((*(int *)(buf + 0x1c4) == 0) &&
           (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 0xfa
           )) {
          xmlGROW((xmlParserCtxtPtr)buf);
        }
        tmp._0_4_ = 0;
        if (*(int *)(buf + 0x110) == -1) {
          (*xmlFree)(_size);
          return (xmlChar *)0x0;
        }
      }
      if (iStack_30 == 1) {
        _size[cur] = (xmlChar)maxLength;
        cur = cur + 1;
      }
      else {
        iVar3 = xmlCopyCharMultiByte(_size + cur,maxLength);
        cur = iVar3 + cur;
      }
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
        *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
        *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
      }
      else {
        *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      }
      *(long *)(*(long *)(buf + 0x38) + 0x20) =
           *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)iStack_30;
      maxLength = xmlCurrentChar((xmlParserCtxtPtr)buf,&stack0xffffffffffffffd0);
      if (maxLength == 0) {
        if ((*(int *)(buf + 0x1c4) == 0) &&
           (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 0xfa
           )) {
          xmlGROW((xmlParserCtxtPtr)buf);
        }
        if (((*(int *)(buf + 0x1c4) == 0) &&
            (500 < *(long *)(*(long *)(buf + 0x38) + 0x20) - *(long *)(*(long *)(buf + 0x38) + 0x18)
            )) && (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20)
                   < 500)) {
          xmlSHRINK((xmlParserCtxtPtr)buf);
        }
        maxLength = xmlCurrentChar((xmlParserCtxtPtr)buf,&stack0xffffffffffffffd0);
      }
    } while (cur <= iVar2);
    xmlFatalErr((xmlParserCtxtPtr)buf,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
    (*xmlFree)(_size);
    *(xmlParserInputState *)(buf + 0x110) = xVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
        if (len > maxLength) {
            xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
            xmlFree(buf);
            ctxt->instate = (xmlParserInputState) state;
            return(NULL);
        }
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}